

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

void event_changelist_remove_all_(event_changelist *changelist,event_base *base)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  
  if (0 < changelist->n_changes) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      bVar5 = (&changelist->changes->read_change)[lVar2] & 8;
      uVar4 = (ulong)(bVar5 == 0);
      pvVar1 = (&base->io)[bVar5 >> 3].entries[*(int *)((long)&changelist->changes->fd + lVar2)];
      uVar3 = uVar3 + 1;
      if (uVar3 != *(uint *)((long)pvVar1 + uVar4 * 8 + 8)) {
        event_changelist_remove_all__cold_1();
      }
      *(undefined4 *)((long)pvVar1 + uVar4 * 8 + 8) = 0;
      lVar2 = lVar2 + 0xc;
    } while ((long)uVar3 < (long)changelist->n_changes);
  }
  changelist->n_changes = 0;
  return;
}

Assistant:

void
event_changelist_remove_all_(struct event_changelist *changelist,
    struct event_base *base)
{
	int i;

	event_changelist_check(base);

	for (i = 0; i < changelist->n_changes; ++i) {
		struct event_change *ch = &changelist->changes[i];
		struct event_changelist_fdinfo *fdinfo =
		    event_change_get_fdinfo(base, ch);
		EVUTIL_ASSERT(fdinfo->idxplus1 == i + 1);
		fdinfo->idxplus1 = 0;
	}

	changelist->n_changes = 0;

	event_changelist_check(base);
}